

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool accountingDiffTolerated
                   (XML_Parser originParser,int tok,char *before,char *after,int source_line,
                   XML_Account account)

{
  ulong uVar1;
  XmlBigCount XVar2;
  XmlBigCount XVar3;
  FILE *pFVar4;
  uchar *puVar5;
  XML_Parser rootParser;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  long lVar9;
  uchar *puVar10;
  float fVar11;
  uint levelsAwayFromRootParser;
  uchar *local_38;
  
  if (tok + 4U < 5) {
    if ((account != XML_ACCOUNT_NONE & (0x1dU >> ((byte)(tok + 4U) & 0x1f) ^ 1)) == 0) {
      return '\x01';
    }
  }
  else if (account == XML_ACCOUNT_NONE) {
    return '\x01';
  }
  rootParser = getRootParserOf(originParser,&levelsAwayFromRootParser);
  if (rootParser->m_parentParser == (XML_Parser)0x0) {
    uVar7 = (long)after - (long)before;
    lVar9 = 0x3b8;
    if (account == XML_ACCOUNT_DIRECT) {
      lVar9 = (ulong)(rootParser != originParser) * 8 + 0x3b0;
    }
    uVar1 = *(ulong *)((long)&rootParser->m_userData + lVar9);
    if (CARRY8(uVar1,uVar7)) {
      bVar8 = false;
    }
    else {
      *(ulong *)((long)&rootParser->m_userData + lVar9) = uVar1 + uVar7;
      XVar2 = (rootParser->m_accounting).countBytesIndirect;
      XVar3 = (rootParser->m_accounting).countBytesDirect;
      local_38 = (uchar *)after;
      fVar11 = accountingGetCurrentAmplification(rootParser);
      bVar8 = true;
      if ((rootParser->m_accounting).activationThresholdBytes <= XVar2 + XVar3) {
        bVar8 = fVar11 <= (rootParser->m_accounting).maximumAmplificationFactor;
      }
      if (1 < (rootParser->m_accounting).debugLevel) {
        accountingReportStats(rootParser,(char *)"");
        if (rootParser->m_parentParser != (XML_Parser)0x0) {
          __assert_fail("! rootParser->m_parentParser",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                        ,0x1eb8,
                        "void accountingReportDiff(XML_Parser, unsigned int, const char *, const char *, ptrdiff_t, int, enum XML_Account)"
                       );
        }
        pcVar6 = "EXP";
        if (account == XML_ACCOUNT_DIRECT) {
          pcVar6 = "DIR";
        }
        fprintf(_stderr," (+%6ld bytes %s|%u, xmlparse.c:%d) %*s\"",uVar7,pcVar6,
                (ulong)levelsAwayFromRootParser,(ulong)(uint)source_line,10,"");
        puVar5 = local_38;
        if (((long)uVar7 < 0x19) || (2 < (rootParser->m_accounting).debugLevel)) {
          for (; pFVar4 = _stderr, before < puVar5; before = (char *)((uchar *)before + 1)) {
            pcVar6 = coda_unsignedCharToPrintable(*before);
            fputs(pcVar6,pFVar4);
          }
        }
        else {
          for (lVar9 = 0; pFVar4 = _stderr, lVar9 != 10; lVar9 = lVar9 + 1) {
            pcVar6 = coda_unsignedCharToPrintable(before[lVar9]);
            fputs(pcVar6,pFVar4);
          }
          fwrite(&DAT_001b231a,4,1,_stderr);
          for (puVar10 = puVar5 + -10; pFVar4 = _stderr, puVar10 < puVar5; puVar10 = puVar10 + 1) {
            pcVar6 = coda_unsignedCharToPrintable(*puVar10);
            fputs(pcVar6,pFVar4);
          }
        }
        fwrite("\"\n",2,1,_stderr);
      }
    }
    return bVar8;
  }
  __assert_fail("! rootParser->m_parentParser",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                ,0x1eed,
                "XML_Bool accountingDiffTolerated(XML_Parser, int, const char *, const char *, int, enum XML_Account)"
               );
}

Assistant:

static XML_Bool
accountingDiffTolerated(XML_Parser originParser, int tok, const char *before,
                        const char *after, int source_line,
                        enum XML_Account account) {
  /* Note: We need to check the token type *first* to be sure that
   *       we can even access variable <after>, safely.
   *       E.g. for XML_TOK_NONE <after> may hold an invalid pointer. */
  switch (tok) {
  case XML_TOK_INVALID:
  case XML_TOK_PARTIAL:
  case XML_TOK_PARTIAL_CHAR:
  case XML_TOK_NONE:
    return XML_TRUE;
  }

  if (account == XML_ACCOUNT_NONE)
    return XML_TRUE; /* because these bytes have been accounted for, already */

  unsigned int levelsAwayFromRootParser;
  const XML_Parser rootParser
      = getRootParserOf(originParser, &levelsAwayFromRootParser);
  assert(! rootParser->m_parentParser);

  const int isDirect
      = (account == XML_ACCOUNT_DIRECT) && (originParser == rootParser);
  const ptrdiff_t bytesMore = after - before;

  XmlBigCount *const additionTarget
      = isDirect ? &rootParser->m_accounting.countBytesDirect
                 : &rootParser->m_accounting.countBytesIndirect;

  /* Detect and avoid integer overflow */
  if (*additionTarget > (XmlBigCount)(-1) - (XmlBigCount)bytesMore)
    return XML_FALSE;
  *additionTarget += bytesMore;

  const XmlBigCount countBytesOutput
      = rootParser->m_accounting.countBytesDirect
        + rootParser->m_accounting.countBytesIndirect;
  const float amplificationFactor
      = accountingGetCurrentAmplification(rootParser);
  const XML_Bool tolerated
      = (countBytesOutput < rootParser->m_accounting.activationThresholdBytes)
        || (amplificationFactor
            <= rootParser->m_accounting.maximumAmplificationFactor);

  if (rootParser->m_accounting.debugLevel >= 2u) {
    accountingReportStats(rootParser, "");
    accountingReportDiff(rootParser, levelsAwayFromRootParser, before, after,
                         bytesMore, source_line, account);
  }

  return tolerated;
}